

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

int impl_verify_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *public_key,
                       uint8_t *msg,size_t msglen,uint8_t *signature,size_t signature_len)

{
  ulong uVar1;
  byte bVar2;
  ushort uVar3;
  char cVar4;
  _Bool _Var5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  uint16_t *puVar11;
  size_t sVar12;
  size_t __size;
  uint8_t *puVar13;
  msgs_t *msgs;
  uint16_t *puVar14;
  randomTape_t *__ptr;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  uint leafIndex;
  uint16_t uVar18;
  ulong uVar19;
  long lVar20;
  size_t i;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint8_t *puVar24;
  uint leafIndex_00;
  proof2_t *ppVar25;
  size_t sVar26;
  randomTape_t *prVar27;
  long lVar28;
  signature2_t sig;
  mzd_local_t m_maskedKey [1];
  uint16_t hideList [1];
  commitments_t Cv;
  commitments_t Ch;
  tree_t treeCv;
  tree_t seed;
  tree_t iSeedsTree;
  mzd_local_t m_plaintext [1];
  int local_248;
  signature2_t local_220;
  mzd_local_t local_1c0;
  uint16_t *local_190;
  uint8_t *local_188;
  commitments_t local_180 [4];
  commitments_t local_138;
  commitments_t local_128;
  lowmc_simulate_online_f local_118;
  size_t local_110;
  uint8_t *local_108;
  tree_t local_100;
  tree_t local_e0 [2];
  tree_t local_a0;
  mzd_local_t local_80 [2];
  
  local_188 = plaintext;
  local_110 = msglen;
  local_108 = msg;
  _Var5 = allocateSignature2(&local_220,instance);
  local_248 = -1;
  if (!_Var5) goto LAB_0011e0d7;
  uVar23 = (ulong)instance->digest_size + 0x20;
  if (uVar23 <= signature_len) {
    memcpy(local_220.challenge,signature,(ulong)instance->digest_size);
    bVar15 = instance->digest_size;
    puVar24 = signature + bVar15;
    local_220.salt._0_8_ = *(undefined8 *)puVar24;
    local_220.salt._8_8_ = *(undefined8 *)(puVar24 + 8);
    local_220.salt._16_8_ = *(undefined8 *)(puVar24 + 0x10);
    local_220.salt._24_8_ = *(undefined8 *)(puVar24 + 0x18);
    expandChallenge(local_220.challengeC,local_220.challengeP,local_220.challenge,instance);
    sVar10 = revealSeedsSize((uint)instance->num_rounds,local_220.challengeC,
                             (ulong)instance->num_opened_rounds,instance);
    local_220.iSeedInfoLen = sVar10;
    if (sVar10 != 0xffffffffffffffff) {
      uVar7 = instance->num_rounds;
      bVar2 = instance->num_opened_rounds;
      puVar11 = getMissingLeavesList(local_220.challengeC,(picnic_instance_t *)(ulong)uVar7);
      sVar12 = openMerkleTreeSize((ulong)instance->num_rounds,puVar11,
                                  (long)(ulong)uVar7 - (ulong)bVar2,instance);
      local_220.cvInfoLen = sVar12;
      free(puVar11);
      local_248 = 1;
      if (sVar12 == 0xffffffffffffffff) goto LAB_0011e0d7;
      local_180[0].hashes._0_2_ = 0;
      __size = revealSeedsSize((uint)instance->num_MPC_parties,(uint16_t *)local_180,1,instance);
      sVar26 = local_220.iSeedInfoLen;
      local_248 = 1;
      if (__size == 0xffffffffffffffff) goto LAB_0011e0d7;
      uVar7 = instance->num_rounds;
      uVar22 = (ulong)uVar7;
      sVar12 = sVar10 + uVar23 + sVar12;
      if (uVar22 != 0) {
        uVar23 = (ulong)instance->num_opened_rounds;
        uVar19 = 0;
        do {
          if (uVar23 != 0) {
            uVar18 = (uint16_t)uVar19;
            if (*local_220.challengeC != uVar18) {
              uVar21 = 0;
              do {
                if (uVar23 - 1 == uVar21) goto LAB_0011d2ba;
                uVar1 = uVar21 + 1;
                lVar20 = uVar21 + 1;
                uVar21 = uVar1;
              } while (local_220.challengeC[lVar20] != uVar18);
              if (uVar23 <= uVar1) goto LAB_0011d2ba;
            }
            lVar20 = 0;
            uVar21 = 0;
            do {
              if (local_220.challengeC[uVar21] == uVar18) {
                lVar20 = lVar20 >> 0x20;
                goto LAB_0011d282;
              }
              lVar20 = lVar20 + 0x100000000;
              uVar21 = uVar21 + 1;
            } while (uVar23 != uVar21);
            lVar20 = -1;
LAB_0011d282:
            uVar21 = 0;
            if (instance->num_MPC_parties - 1 != (uint)local_220.challengeP[lVar20]) {
              uVar21 = (ulong)instance->view_size;
            }
            sVar12 = sVar12 + __size + (ulong)instance->view_size + (ulong)instance->digest_size +
                     (ulong)instance->input_output_size + uVar21;
          }
LAB_0011d2ba:
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar22);
      }
      if (sVar12 != signature_len) goto LAB_0011e0d7;
      puVar24 = signature + (ulong)bVar15 + 0x20;
      local_220.iSeedInfo = (uint8_t *)malloc(local_220.iSeedInfoLen);
      memcpy(local_220.iSeedInfo,puVar24,sVar26);
      sVar10 = local_220.cvInfoLen;
      local_220.cvInfo = (uint8_t *)malloc(local_220.cvInfoLen);
      memcpy(local_220.cvInfo,puVar24 + sVar26,sVar10);
      if (uVar7 != 0) {
        puVar24 = puVar24 + sVar26 + sVar10;
        uVar23 = 0;
        do {
          uVar19 = (ulong)instance->num_opened_rounds;
          if (uVar19 != 0) {
            uVar18 = (uint16_t)uVar23;
            if (*local_220.challengeC != uVar18) {
              uVar21 = 0;
              do {
                if (uVar19 - 1 == uVar21) goto LAB_0011d577;
                uVar1 = uVar21 + 1;
                lVar20 = uVar21 + 1;
                uVar21 = uVar1;
              } while (local_220.challengeC[lVar20] != uVar18);
              if (uVar19 <= uVar1) goto LAB_0011d577;
            }
            allocateProof2(local_220.proofs + uVar23,instance);
            ppVar25 = local_220.proofs;
            local_220.proofs[uVar23].seedInfoLen = __size;
            puVar13 = (uint8_t *)malloc(__size);
            ppVar25[uVar23].seedInfo = puVar13;
            memcpy(puVar13,puVar24,__size);
            uVar22 = 0xffffffffffffffff;
            if ((ulong)instance->num_opened_rounds != 0) {
              uVar19 = 0;
              do {
                uVar22 = uVar19;
                if (local_220.challengeC[uVar19] == uVar18) break;
                uVar19 = uVar19 + 1;
                uVar22 = 0xffffffffffffffff;
              } while (instance->num_opened_rounds != uVar19);
            }
            puVar24 = puVar24 + ppVar25[uVar23].seedInfoLen;
            if (instance->num_MPC_parties - 1 != (uint)local_220.challengeP[uVar22]) {
              memcpy(ppVar25[uVar23].aux,puVar24,(ulong)instance->view_size);
              bVar15 = instance->view_size;
              if ((~(0xff << ((uint)(instance->lowmc).m * (uint)(instance->lowmc).r * -3 +
                              (uint)bVar15 * 8 & 0x1f)) &
                  (uint)local_220.proofs[uVar23].aux[(ulong)bVar15 - 1]) != 0) {
                local_248 = -1;
                goto LAB_0011e0d7;
              }
              puVar24 = puVar24 + bVar15;
              ppVar25 = local_220.proofs;
            }
            memcpy(ppVar25[uVar23].input,puVar24,(ulong)instance->input_output_size);
            bVar15 = instance->input_output_size;
            local_248 = -1;
            if ((~(0xff << ((uint)bVar15 * 8 - (uint)(instance->lowmc).n & 0x1f)) &
                (uint)local_220.proofs[uVar23].input[(ulong)bVar15 - 1]) != 0) goto LAB_0011e0d7;
            bVar2 = instance->view_size;
            uVar19 = (ulong)bVar2;
            puVar24 = puVar24 + bVar15;
            memcpy(local_220.proofs[uVar23].msgs,puVar24,uVar19);
            if ((~(0xff << ((uint)(instance->lowmc).m * (uint)(instance->lowmc).r * -3 +
                            (uint)bVar2 * 8 & 0x1f)) &
                (uint)local_220.proofs[uVar23].msgs[uVar19 - 1]) != 0) goto LAB_0011e0d7;
            memcpy(local_220.proofs[uVar23].C,puVar24 + uVar19,(ulong)instance->digest_size);
            uVar22 = (ulong)instance->num_rounds;
            puVar24 = puVar24 + uVar19 + instance->digest_size;
          }
LAB_0011d577:
          uVar23 = uVar23 + 1;
        } while (uVar23 < uVar22);
      }
      allocateCommitments2(local_180,instance,(ulong)instance->num_MPC_parties);
      allocateCommitments2(local_180 + 1,instance,(ulong)instance->num_MPC_parties);
      allocateCommitments2(local_180 + 2,instance,(ulong)instance->num_MPC_parties);
      allocateCommitments2(local_180 + 3,instance,(ulong)instance->num_MPC_parties);
      msgs = allocateMsgsVerify(instance);
      if (msgs != (msgs_t *)0x0) {
        _Var5 = createTree(&local_100,(uint)instance->num_rounds,(uint)instance->digest_size);
        local_248 = -1;
        if (_Var5) {
          uVar23 = (ulong)((uint)instance->num_opened_rounds * 2);
          puVar11 = (uint16_t *)malloc(uVar23);
          puVar14 = (uint16_t *)malloc(uVar23);
          uVar7 = instance->num_rounds;
          __ptr = (randomTape_t *)malloc((ulong)uVar7 * 0x98);
          local_248 = -1;
          local_190 = puVar14;
          if ((((puVar11 != (uint16_t *)0x0) && (puVar14 != (uint16_t *)0x0)) &&
              (__ptr != (randomTape_t *)0x0)) &&
             (_Var5 = createTree(&local_a0,(uint)uVar7,(uint)instance->seed_size), _Var5)) {
            iVar8 = reconstructSeeds(&local_a0,local_220.challengeC,
                                     (ulong)instance->num_opened_rounds,local_220.iSeedInfo,
                                     local_220.iSeedInfoLen,local_220.salt,0,instance);
            if (iVar8 == 0) {
              allocateCommitments2(&local_128,instance,(ulong)instance->num_rounds);
              allocateCommitments2(&local_138,instance,(ulong)instance->num_rounds);
              mzd_from_char_array(local_80,local_188,(ulong)instance->input_output_size);
              uVar23 = (ulong)instance->num_MPC_parties;
              local_118 = lowmc_simulate_online_get_implementation(&instance->lowmc);
              if (instance->num_rounds == 0) {
                bVar15 = instance->num_opened_rounds;
LAB_0011dcfe:
                uVar7 = 0;
              }
              else {
                sVar10 = uVar23 - 1;
                sVar12 = 0;
                do {
                  uVar22 = (ulong)instance->num_opened_rounds;
                  leafIndex = (uint)sVar12;
                  if (uVar22 == 0) {
LAB_0011d7f1:
                    bVar15 = instance->num_MPC_parties;
                    puVar24 = getLeaf(&local_a0,leafIndex);
                    _Var5 = generateSeeds(local_e0,(uint)bVar15,puVar24,local_220.salt,sVar12,
                                          instance);
                    if (!_Var5) goto LAB_0011e000;
                  }
                  else {
                    if (sVar12 != *local_220.challengeC) {
                      uVar19 = 0;
                      do {
                        if (uVar22 - 1 == uVar19) goto LAB_0011d7f1;
                        lVar20 = uVar19 + 1;
                        uVar19 = uVar19 + 1;
                      } while (sVar12 != local_220.challengeC[lVar20]);
                      if (uVar22 <= uVar19) goto LAB_0011d7f1;
                    }
                    _Var5 = createTree(local_e0,(uint)instance->num_MPC_parties,
                                       (uint)instance->seed_size);
                    if (!_Var5) goto LAB_0011e000;
                    uVar22 = 0xffffffffffffffff;
                    if ((ulong)instance->num_opened_rounds != 0) {
                      uVar19 = 0;
                      do {
                        uVar22 = uVar19;
                        if (sVar12 == local_220.challengeC[uVar19]) break;
                        uVar19 = uVar19 + 1;
                        uVar22 = 0xffffffffffffffff;
                      } while (instance->num_opened_rounds != uVar19);
                    }
                    local_1c0.w64[0] = CONCAT62(local_1c0.w64[0]._2_6_,local_220.challengeP[uVar22])
                    ;
                    iVar8 = reconstructSeeds(local_e0,(uint16_t *)&local_1c0,1,
                                             local_220.proofs[sVar12].seedInfo,
                                             local_220.proofs[sVar12].seedInfoLen,local_220.salt,
                                             leafIndex,instance);
                    if (iVar8 != 0) {
                      clearTree(local_e0);
                      goto LAB_0011e000;
                    }
                  }
                  prVar27 = __ptr + sVar12;
                  puVar24 = getLeaves(local_e0);
                  createRandomTapes(prVar27,puVar24,local_220.salt,sVar12,instance);
                  uVar22 = (ulong)instance->num_opened_rounds;
                  if (uVar22 == 0) {
LAB_0011d92d:
                    computeAuxTape(prVar27,(uint8_t *)0x0,instance);
                    if (instance->num_MPC_parties != '\0') {
                      lVar20 = 0;
                      sVar26 = 0;
                      do {
                        uVar9 = (uint)sVar26;
                        local_1c0.w64[0] = (word)getLeaf(local_e0,uVar9);
                        local_1c0.w64[1] = (word)getLeaf(local_e0,uVar9 + 1);
                        local_1c0.w64[2] = (word)getLeaf(local_e0,uVar9 + 2);
                        local_1c0.w64[3] = (word)getLeaf(local_e0,uVar9 + 3);
                        commit_x4((uint8_t **)
                                  (*(long *)((long)&local_180[0].hashes +
                                            (ulong)((leafIndex & 3) << 4)) + lVar20),
                                  (uint8_t **)&local_1c0,local_220.salt,sVar12,sVar26,instance);
                        sVar26 = sVar26 + 4;
                        lVar20 = lVar20 + 0x20;
                      } while (sVar26 < instance->num_MPC_parties);
                    }
                    puVar24 = *(uint8_t **)
                               (*(long *)((long)&local_180[0].hashes + (ulong)((leafIndex & 3) << 4)
                                         ) + -8 + uVar23 * 8);
                    puVar13 = getLeaf(local_e0,(uint)sVar10);
                    commit(puVar24,puVar13,prVar27->aux_bits,local_220.salt,sVar12,sVar10,instance);
                  }
                  else {
                    if (sVar12 != *local_220.challengeC) {
                      uVar19 = 0;
                      do {
                        if (uVar22 - 1 == uVar19) goto LAB_0011d92d;
                        lVar20 = uVar19 + 1;
                        uVar19 = uVar19 + 1;
                      } while (sVar12 != local_220.challengeC[lVar20]);
                      if (uVar22 <= uVar19) goto LAB_0011d92d;
                    }
                    lVar20 = 0;
                    uVar19 = 0;
                    do {
                      if (sVar12 == local_220.challengeC[uVar19]) {
                        lVar20 = lVar20 >> 0x20;
                        goto LAB_0011da5a;
                      }
                      lVar20 = lVar20 + 0x100000000;
                      uVar19 = uVar19 + 1;
                    } while (uVar22 != uVar19);
                    lVar20 = -1;
LAB_0011da5a:
                    uVar7 = local_220.challengeP[lVar20];
                    uVar9 = leafIndex & 3;
                    if (instance->num_MPC_parties != '\0') {
                      lVar20 = 0;
                      sVar26 = 0;
                      do {
                        leafIndex_00 = (uint)sVar26;
                        local_1c0.w64[0] = (word)getLeaf(local_e0,leafIndex_00);
                        local_1c0.w64[1] = (word)getLeaf(local_e0,leafIndex_00 + 1);
                        local_1c0.w64[2] = (word)getLeaf(local_e0,leafIndex_00 + 2);
                        local_1c0.w64[3] = (word)getLeaf(local_e0,leafIndex_00 + 3);
                        commit_x4((uint8_t **)
                                  (*(long *)((long)&local_180[0].hashes + (ulong)(uVar9 << 4)) +
                                  lVar20),(uint8_t **)&local_1c0,local_220.salt,sVar12,sVar26,
                                  instance);
                        sVar26 = sVar26 + 4;
                        lVar20 = lVar20 + 0x20;
                      } while (sVar26 < instance->num_MPC_parties);
                    }
                    if (sVar10 != uVar7) {
                      puVar24 = *(uint8_t **)
                                 (*(long *)((long)&local_180[0].hashes + (ulong)(uVar9 << 4)) + -8 +
                                 uVar23 * 8);
                      puVar13 = getLeaf(local_e0,(uint)sVar10);
                      commit(puVar24,puVar13,local_220.proofs[sVar12].aux,local_220.salt,sVar12,
                             sVar10,instance);
                    }
                    memcpy(*(void **)(*(long *)((long)&local_180[0].hashes + (ulong)(uVar9 << 4)) +
                                     (ulong)uVar7 * 8),local_220.proofs[sVar12].C,
                           (ulong)instance->digest_size);
                  }
                  if (sVar12 < (instance->num_rounds & 0xfffffffc)) {
                    if ((leafIndex + 1 & 3) == 0) {
                      commit_h_x4((uint8_t **)
                                  ((ulong)((leafIndex & 0xfffc) << 3) + (long)local_128.hashes),
                                  local_180,instance);
                    }
                  }
                  else {
                    commit_h(local_128.hashes[sVar12],
                             (commitments_t *)
                             ((long)&local_180[0].hashes + (ulong)((leafIndex & 3) << 4)),instance);
                  }
                  clearTree(local_e0);
                  uVar7 = instance->num_rounds;
                  sVar12 = sVar12 + 1;
                } while (sVar12 < uVar7);
                bVar15 = instance->num_opened_rounds;
                if (uVar7 == 0) goto LAB_0011dcfe;
                uVar23 = 0;
                do {
                  if (bVar15 == 0) {
LAB_0011dc9a:
                    local_138.hashes[uVar23] = (uint8_t *)0x0;
                  }
                  else if (uVar23 != *local_220.challengeC) {
                    uVar22 = 0;
                    do {
                      if ((ulong)bVar15 - 1 == uVar22) goto LAB_0011dc9a;
                      lVar20 = uVar22 + 1;
                      uVar22 = uVar22 + 1;
                    } while (uVar23 != local_220.challengeC[lVar20]);
                    if (bVar15 <= uVar22) goto LAB_0011dc9a;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar7);
              }
              if (bVar15 == 0) {
                bVar15 = 0;
              }
              else {
                uVar23 = 0;
                do {
                  uVar7 = local_220.challengeC[uVar23];
                  uVar3 = local_220.challengeP[uVar23];
                  prVar27 = __ptr + uVar7;
                  puVar24 = local_220.proofs[uVar7].input;
                  bVar15 = (instance->lowmc).r;
                  if (bVar15 != 0) {
                    puVar13 = local_220.proofs[uVar7].aux;
                    bVar2 = instance->num_MPC_parties;
                    uVar6 = (instance->lowmc).n;
                    lVar28 = 1;
                    uVar22 = 0;
                    lVar20 = 0;
                    do {
                      if (uVar6 == 0) {
                        uVar6 = 0;
                      }
                      else {
                        uVar19 = (ulong)uVar6;
                        uVar21 = 0;
                        do {
                          uVar1 = lVar20 + uVar21;
                          uVar17 = lVar28 * uVar19 + uVar21 >> 3;
                          cVar4 = (char)uVar21;
                          uVar21 = uVar21 + 1;
                          bVar16 = ~((char)lVar28 * (char)uVar19 + cVar4);
                          bVar15 = bVar16 & 7;
                          prVar27->tape[(ulong)bVar2 - 1][uVar17] =
                               ((puVar13[uVar1 >> 3] >> (~(byte)uVar1 & 7) & 1) != 0) <<
                               (bVar16 & 7) |
                               (-2 << bVar15 | 0xfeU >> 8 - bVar15) &
                               prVar27->tape[(ulong)bVar2 - 1][uVar17];
                          uVar6 = (instance->lowmc).n;
                          uVar19 = (ulong)uVar6;
                        } while (uVar21 < uVar19);
                        lVar20 = lVar20 + uVar21;
                        bVar15 = (instance->lowmc).r;
                      }
                      uVar22 = uVar22 + 1;
                      lVar28 = lVar28 + 2;
                    } while (uVar22 < bVar15);
                  }
                  uVar22 = (ulong)((uint)uVar3 * 8);
                  memset(*(void **)((long)prVar27->tape + uVar22),0,
                         (ulong)((uint)instance->view_size * 2));
                  memcpy(*(void **)((long)msgs->msgs + uVar22),local_220.proofs[uVar7].msgs,
                         (ulong)instance->view_size);
                  mzd_from_char_array(&local_1c0,puVar24,(ulong)instance->input_output_size);
                  msgs->unopened = (uint)uVar3;
                  msgs->pos = 0;
                  iVar8 = (*local_118)(&local_1c0,prVar27,msgs,local_80,public_key,instance);
                  if (iVar8 != 0) goto LAB_0011e000;
                  commit_v(local_138.hashes[uVar7],local_220.proofs[uVar7].input,msgs,instance);
                  bVar15 = instance->num_opened_rounds;
                  uVar23 = uVar23 + 1;
                } while (uVar23 < bVar15);
                uVar7 = instance->num_rounds;
              }
              puVar14 = getMissingLeavesList(local_220.challengeC,(picnic_instance_t *)(ulong)uVar7)
              ;
              iVar8 = addMerkleNodes(&local_100,puVar14,(long)(ulong)uVar7 - (ulong)bVar15,
                                     local_220.cvInfo,local_220.cvInfoLen);
              free(puVar14);
              local_248 = -1;
              if ((iVar8 == 0) &&
                 (iVar8 = verifyMerkleTree(&local_100,local_138.hashes,local_220.salt,instance),
                 iVar8 == 0)) {
                HCP((uint8_t *)local_e0,puVar11,local_190,&local_128,local_100.nodes,local_220.salt,
                    public_key,local_188,local_108,local_110,instance);
                iVar8 = bcmp(local_220.challenge,local_e0,(ulong)instance->digest_size);
                local_248 = -(uint)(iVar8 != 0);
              }
              goto LAB_0011e005;
            }
            goto LAB_0011e06a;
          }
          goto LAB_0011e077;
        }
        goto LAB_0011e0a3;
      }
      local_248 = -1;
      goto LAB_0011e0ad;
    }
  }
  local_248 = 1;
  goto LAB_0011e0d7;
LAB_0011e000:
  local_248 = -1;
LAB_0011e005:
  if (instance->num_rounds != 0) {
    uVar23 = 0;
    prVar27 = __ptr;
    do {
      freeRandomTape(prVar27);
      uVar23 = uVar23 + 1;
      prVar27 = prVar27 + 1;
    } while (uVar23 < instance->num_rounds);
  }
  freeCommitments2(&local_138);
  freeCommitments2(&local_128);
LAB_0011e06a:
  clearTree(&local_a0);
LAB_0011e077:
  free(__ptr);
  free(local_190);
  free(puVar11);
  clearTree(&local_100);
LAB_0011e0a3:
  freeMsgs(msgs);
LAB_0011e0ad:
  freeCommitments2(local_180 + 3);
  freeCommitments2(local_180 + 2);
  freeCommitments2(local_180 + 1);
  freeCommitments2(local_180);
LAB_0011e0d7:
  freeSignature2(&local_220,instance);
  return local_248;
}

Assistant:

int impl_verify_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                        const uint8_t* public_key, const uint8_t* msg, size_t msglen,
                        const uint8_t* signature, size_t signature_len) {
  int ret = -1;
  signature2_t sig;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = deserializeSignature2(&sig, signature, signature_len, instance);
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to deserialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = verify_picnic3(&sig, public_key, plaintext, msg, msglen, instance);

Exit:
  freeSignature2(&sig, instance);
  return ret;
}